

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

int __thiscall jaegertracing::net::Socket::close(Socket *this,int __fd)

{
  Socket *this_local;
  
  if (-1 < this->_handle) {
    ::close(this->_handle);
    this->_handle = -1;
  }
  return (int)this;
}

Assistant:

void close() noexcept
    {
        if (_handle >= 0) {
#ifdef WIN32
            ::closesocket(_handle);
#else
            ::close(_handle);
#endif
            _handle = -1;
        }
    }